

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O3

bool __thiscall bloom_filter::contains(bloom_filter *this,uchar *key_begin,size_t length)

{
  pointer puVar1;
  uint *puVar2;
  uint *puVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  ulong local_48;
  size_t bit_index;
  size_t bit;
  
  local_48 = 0;
  bit_index = 0;
  puVar1 = (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish == puVar1) {
    bVar7 = true;
  }
  else {
    uVar6 = 0;
    do {
      bit._4_4_ = puVar1[uVar6];
      puVar2 = (uint *)key_begin;
      puVar3 = (uint *)key_begin;
      uVar4 = length;
      if (7 < length) {
        do {
          puVar3 = puVar2 + 2;
          bit._4_4_ = ~(bit._4_4_ ^
                       (bit._4_4_ >> 5 ^ puVar2[1]) + bit._4_4_ * 0x800 ^ bit._4_4_ << 7 ^
                       (bit._4_4_ >> 3) * *puVar2);
          uVar4 = uVar4 - 8;
          puVar2 = puVar3;
        } while (7 < uVar4);
      }
      if (uVar4 != 0) {
        if (uVar4 < 4) {
          iVar5 = 0;
          if (uVar4 != 1) {
            bit._4_4_ = ~((bit._4_4_ >> 5 ^ (uint)(ushort)*puVar3) + bit._4_4_ * 0x800 ^ bit._4_4_);
            iVar5 = 1;
LAB_001543cf:
            uVar4 = uVar4 - 2;
            puVar3 = (uint *)((long)puVar3 + 2);
            goto LAB_001543d7;
          }
        }
        else {
          bit._4_4_ = ~(bit._4_4_ ^ (bit._4_4_ >> 5 ^ *puVar3) + bit._4_4_ * 0x800);
          uVar4 = uVar4 - 4;
          puVar3 = puVar3 + 1;
          iVar5 = 1;
          if (1 < uVar4) {
            bit._4_4_ = (bit._4_4_ >> 3) * (uint)(ushort)*puVar3 ^ bit._4_4_ << 7 ^ bit._4_4_;
            iVar5 = 2;
            goto LAB_001543cf;
          }
LAB_001543d7:
          if (uVar4 == 0) goto LAB_001543ed;
        }
        bit._4_4_ = iVar5 + bit._4_4_ + (bit._4_4_ * -0x5a5a5a5b ^ (uint)(byte)*puVar3);
      }
LAB_001543ed:
      (*this->_vptr_bloom_filter[4])(this,(long)&bit + 4,&local_48,&bit_index);
      bVar7 = (bit_mask[bit_index] &
              ~(this->bit_table_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start[local_48 >> 3]) == 0;
      if (!bVar7) {
        return bVar7;
      }
      uVar6 = uVar6 + 1;
      puVar1 = (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->salt_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2));
  }
  return bVar7;
}

Assistant:

inline virtual bool contains(const unsigned char* key_begin, const std::size_t length) const
   {
      std::size_t bit_index = 0;
      std::size_t bit       = 0;

      for (std::size_t i = 0; i < salt_.size(); ++i)
      {
         compute_indices(hash_ap(key_begin, length, salt_[i]), bit_index, bit);

         if ((bit_table_[bit_index / bits_per_char] & bit_mask[bit]) != bit_mask[bit])
         {
            return false;
         }
      }

      return true;
   }